

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# proto.cc
# Opt level: O0

uint64_t absl::lts_20250127::log_internal::anon_unknown_4::Decode64Bit(Span<const_char> *buf)

{
  size_type sVar1;
  byte *pbVar2;
  ulong local_20;
  size_t s;
  uint64_t value;
  Span<const_char> *buf_local;
  
  s = 0;
  local_20 = 0;
  do {
    sVar1 = Span<const_char>::size(buf);
    if (sVar1 <= local_20) break;
    pbVar2 = (byte *)Span<const_char>::operator[](buf,local_20);
    s = (ulong)*pbVar2 << ((byte)(local_20 << 3) & 0x3f) | s;
    local_20 = local_20 + 1;
  } while (local_20 != 8);
  Span<const_char>::remove_prefix(buf,local_20);
  return s;
}

Assistant:

uint64_t Decode64Bit(absl::Span<const char> *buf) {
  uint64_t value = 0;
  size_t s = 0;
  while (s < buf->size()) {
    value |= static_cast<uint64_t>(static_cast<unsigned char>((*buf)[s]))
             << 8 * s;
    if (++s == sizeof(value)) break;
  }
  buf->remove_prefix(s);
  return value;
}